

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O1

Literal * wasm::Literal::makeNull(Literal *__return_storage_ptr__,HeapType type)

{
  BasicHeapType BVar1;
  HeapType local_18;
  HeapType type_local;
  
  local_18.id = type.id;
  BVar1 = HeapType::getBottom(&local_18);
  if (((uint)(0x7c < BVar1) * 4 + 3 & BVar1) == 0) {
    wasm::Literal::Literal(__return_storage_ptr__,(Type)((ulong)BVar1 | 2));
    return __return_storage_ptr__;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

static Literal makeNull(HeapType type) {
    return Literal(Type(type.getBottom(), Nullable));
  }